

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_setlocal(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  int iVar3;
  TValue *pTVar4;
  char *str;
  uint uVar5;
  lua_State *L_00;
  lua_Debug ar;
  
  pTVar1 = L->base;
  uVar5 = 0;
  L_00 = L;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff9)) {
    uVar5 = 1;
    L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  iVar2 = lj_lib_checkint(L,uVar5 + 1);
  iVar3 = lua_getstack(L_00,iVar2,&ar);
  if (iVar3 == 0) {
    lj_err_arg(L,uVar5 + 1,LJ_ERR_LVLRNG);
  }
  pTVar4 = lj_lib_checkany(L,uVar5 + 3);
  pTVar1 = L_00->top;
  L_00->top = pTVar1 + 1;
  *pTVar1 = *pTVar4;
  iVar2 = lj_lib_checkint(L,uVar5 | 2);
  str = lua_setlocal(L_00,&ar,iVar2);
  lua_pushstring(L,str);
  return 1;
}

Assistant:

LJLIB_CF(debug_setlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  TValue *tv;
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  tv = lj_lib_checkany(L, arg+3);
  copyTV(L1, L1->top++, tv);
  lua_pushstring(L, lua_setlocal(L1, &ar, lj_lib_checkint(L, arg+2)));
  return 1;
}